

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O2

bool __thiscall
QMetaMethod::invokeImpl
          (QMetaMethod *this,QMetaMethod self,void *target,ConnectionType connectionType,
          qsizetype paramCount,void **parameters,char **typeNames,QMetaTypeInterface **metaTypes)

{
  long lVar1;
  bool bVar2;
  InvokeFailReason IVar3;
  void *pvVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  Data *in_stack_ffffffffffffff88;
  char *local_70;
  QMessageLogger local_60;
  QMetaMethod self_local;
  
  self_local.data.d = (uint *)self.mobj;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  self_local.mobj = (QMetaObject *)this;
  if (this != (QMetaMethod *)0x0 && self.data.d.d != (uint *)0x0) {
    IVar3 = QMetaMethodInvoker::invokeImpl
                      ((QMetaMethodInvoker *)this,self,target,connectionType,paramCount,parameters,
                       typeNames,(QMetaTypeInterface **)in_stack_ffffffffffffff88);
    bVar2 = true;
    if (IVar3 == None) goto LAB_00262145;
    if (IVar3 < FormalParameterMismatch) {
      if (IVar3 != TooFewArguments) goto LAB_00262143;
      local_60.context.version = 2;
      local_60.context.function._4_4_ = 0;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.category = "default";
      QVar5 = objectClassName((QMetaObject *)this);
      methodSignature((QByteArray *)&stack0xffffffffffffff88,&self_local);
      if (local_70 == (char *)0x0) {
        local_70 = &QByteArray::_empty;
      }
      QMessageLogger::warning
                (&local_60,"QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 connectionType,QVar5.m_data,local_70);
    }
    else {
      local_60.context.version = 2;
      local_60.context._4_8_ = 0;
      local_60.context._12_8_ = 0;
      local_60.context.function._4_4_ = 0;
      local_60.context.category = "default";
      pvVar4 = parameters[(uint)(IVar3 + (CouldNotQueueParameter|TooFewArguments))];
      if (pvVar4 == (void *)0x0) {
        pvVar4 = *(void **)(typeNames[(uint)(IVar3 + (CouldNotQueueParameter|TooFewArguments))] +
                           0x18);
      }
      QVar5 = objectClassName((QMetaObject *)this);
      methodSignature((QByteArray *)&stack0xffffffffffffff88,&self_local);
      if (local_70 == (char *)0x0) {
        local_70 = &QByteArray::_empty;
      }
      QMessageLogger::warning
                (&local_60,
                 "QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s"
                 ,(ulong)(uint)(IVar3 + CouldNotQueueParameter),pvVar4,QVar5.m_data,local_70);
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&stack0xffffffffffffff88)
    ;
  }
LAB_00262143:
  bVar2 = false;
LAB_00262145:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaMethod::invokeImpl(QMetaMethod self, void *target, Qt::ConnectionType connectionType,
                             qsizetype paramCount, const void *const *parameters,
                             const char *const *typeNames,
                             const QtPrivate::QMetaTypeInterface *const *metaTypes)
{
    if (!target || !self.mobj)
        return false;
    QMetaMethodPrivate::InvokeFailReason r =
            QMetaMethodPrivate::invokeImpl(self, target, connectionType, paramCount, parameters,
                                           typeNames, metaTypes);
    if (Q_LIKELY(r == QMetaMethodPrivate::InvokeFailReason::None))
        return true;

    if (int(r) >= int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch)) {
        int n = int(r) - int(QMetaMethodPrivate::InvokeFailReason::FormalParameterMismatch);
        qWarning("QMetaMethod::invoke: cannot convert formal parameter %d from %s in call to %s::%s",
                 n, typeNames[n + 1] ? typeNames[n + 1] : metaTypes[n + 1]->name,
                 self.mobj->className(), self.methodSignature().constData());
    }
    if (r == QMetaMethodPrivate::InvokeFailReason::TooFewArguments) {
        qWarning("QMetaMethod::invoke: too few arguments (%d) in call to %s::%s",
                 int(paramCount), self.mobj->className(), self.methodSignature().constData());
    }
    return false;
}